

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall CaDiCaL::Proof::add_constraint(Proof *this,vector<int,_std::allocator<int>_> *c)

{
  pointer piVar1;
  int *lit;
  pointer __x;
  
  piVar1 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (__x = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start; __x != piVar1; __x = __x + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->clause,__x);
  }
  add_constraint(this);
  return;
}

Assistant:

void Proof::add_constraint (const vector<int> &c) {
  // literals of c are already external
  assert (clause.empty ());
  assert (proof_chain.empty ());
  for (const auto &lit : c)
    clause.push_back (lit);
  add_constraint ();
}